

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall
ON_SubDComponentList::CreateFromVertexList
          (ON_SubDComponentList *this,ON_SubD *subd,
          ON_SimpleArray<const_ON_SubDVertex_*> *vertex_list)

{
  bool bVar1;
  uint uVar2;
  uint marked_component_count;
  ON_ComponentStatus *this_00;
  ulong uVar3;
  ON_SubDComponentMarksClearAndRestore saved_marks;
  ON_SubDComponentMarksClearAndRestore local_70;
  
  ON_SubDComponentMarksClearAndRestore::ON_SubDComponentMarksClearAndRestore(&local_70,subd);
  uVar2 = vertex_list->m_count;
  if ((ulong)uVar2 == 0) {
    marked_component_count = 0;
  }
  else {
    uVar3 = 0;
    marked_component_count = 0;
    do {
      if (vertex_list->m_a[uVar3] != (ON_SubDVertex *)0x0) {
        this_00 = &(vertex_list->m_a[uVar3]->super_ON_SubDComponentBase).m_status;
        bVar1 = ON_ComponentStatus::RuntimeMark(this_00);
        if (!bVar1) {
          ON_ComponentStatus::SetRuntimeMark(this_00);
          marked_component_count = marked_component_count + 1;
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  uVar2 = Internal_Create(this,subd,true,false,false,true,marked_component_count);
  ON_SubDComponentMarksClearAndRestore::~ON_SubDComponentMarksClearAndRestore(&local_70);
  return uVar2;
}

Assistant:

unsigned ON_SubDComponentList::CreateFromVertexList(const ON_SubD& subd, const ON_SimpleArray<const ON_SubDVertex*>& vertex_list)
{
  ON_SubDComponentMarksClearAndRestore saved_marks(subd);
  const unsigned count = vertex_list.UnsignedCount();
  unsigned marked_count = 0;
  for (unsigned i = 0; i < count; ++i)
  {
    const ON_SubDVertex* v = vertex_list[i];
    if (nullptr == v)
      continue;
    if (v->m_status.RuntimeMark())
      continue;
    v->m_status.SetRuntimeMark();
    ++marked_count;
  }
  return Internal_Create(subd, true, false, false, true, marked_count);
}